

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error handleUnknownEncoding(XML_Parser parser,XML_Char *encodingName)

{
  _func_void_ptr_size_t *p_Var1;
  int iVar2;
  void *pvVar3;
  ENCODING *pEVar4;
  ENCODING *enc;
  undefined1 local_438 [4];
  int i;
  XML_Encoding info;
  XML_Char *encodingName_local;
  XML_Parser parser_local;
  
  if (parser->m_unknownEncodingHandler != (XML_UnknownEncodingHandler)0x0) {
    for (enc._4_4_ = 0; enc._4_4_ < 0x100; enc._4_4_ = enc._4_4_ + 1) {
      *(undefined4 *)(local_438 + (long)enc._4_4_ * 4) = 0xffffffff;
    }
    info.data = (void *)0x0;
    info.map[0xfe] = 0;
    info.map[0xff] = 0;
    info.convert = (_func_int_void_ptr_char_ptr *)0x0;
    info.release = (_func_void_void_ptr *)encodingName;
    iVar2 = (*parser->m_unknownEncodingHandler)
                      (parser->m_unknownEncodingHandlerData,encodingName,(XML_Encoding *)local_438);
    if (iVar2 != 0) {
      p_Var1 = (parser->m_mem).malloc_fcn;
      iVar2 = XmlSizeOfUnknownEncoding();
      pvVar3 = (*p_Var1)((long)iVar2);
      parser->m_unknownEncodingMem = pvVar3;
      if (parser->m_unknownEncodingMem == (void *)0x0) {
        if (info.convert != (_func_int_void_ptr_char_ptr *)0x0) {
          (*info.convert)((void *)info.map._1016_8_,encodingName);
        }
        return XML_ERROR_NO_MEMORY;
      }
      encodingName = local_438;
      pEVar4 = XmlInitUnknownEncoding
                         (parser->m_unknownEncodingMem,(int *)encodingName,(CONVERTER)info.data,
                          (void *)info.map._1016_8_);
      if (pEVar4 != (ENCODING *)0x0) {
        parser->m_unknownEncodingData = (void *)info.map._1016_8_;
        parser->m_unknownEncodingRelease = (_func_void_void_ptr *)info.convert;
        parser->m_encoding = pEVar4;
        return XML_ERROR_NONE;
      }
    }
    if (info.convert != (_func_int_void_ptr_char_ptr *)0x0) {
      (*info.convert)((void *)info.map._1016_8_,encodingName);
    }
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}

Assistant:

static enum XML_Error
handleUnknownEncoding(XML_Parser parser, const XML_Char *encodingName) {
  if (parser->m_unknownEncodingHandler) {
    XML_Encoding info;
    int i;
    for (i = 0; i < 256; i++)
      info.map[i] = -1;
    info.convert = NULL;
    info.data = NULL;
    info.release = NULL;
    if (parser->m_unknownEncodingHandler(parser->m_unknownEncodingHandlerData,
                                         encodingName, &info)) {
      ENCODING *enc;
      parser->m_unknownEncodingMem = MALLOC(parser, XmlSizeOfUnknownEncoding());
      if (! parser->m_unknownEncodingMem) {
        if (info.release)
          info.release(info.data);
        return XML_ERROR_NO_MEMORY;
      }
      enc = (parser->m_ns ? XmlInitUnknownEncodingNS : XmlInitUnknownEncoding)(
          parser->m_unknownEncodingMem, info.map, info.convert, info.data);
      if (enc) {
        parser->m_unknownEncodingData = info.data;
        parser->m_unknownEncodingRelease = info.release;
        parser->m_encoding = enc;
        return XML_ERROR_NONE;
      }
    }
    if (info.release != NULL)
      info.release(info.data);
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}